

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampleMOD.cpp
# Opt level: O0

void __thiscall WDL_Resampler::~WDL_Resampler(WDL_Resampler *this)

{
  WDL_Resampler_Filter *pWVar1;
  WDL_Resampler *this_local;
  
  pWVar1 = this->m_pre_filter;
  if (pWVar1 != (WDL_Resampler_Filter *)0x0) {
    WDL_Resampler_Filter::~WDL_Resampler_Filter(pWVar1);
    operator_delete(pWVar1);
  }
  pWVar1 = this->m_post_filter;
  if (pWVar1 != (WDL_Resampler_Filter *)0x0) {
    WDL_Resampler_Filter::~WDL_Resampler_Filter(pWVar1);
    operator_delete(pWVar1);
  }
  WDL_TypedBuf<float>::~WDL_TypedBuf(&this->m_filter_coeffs);
  WDL_TypedBuf<float>::~WDL_TypedBuf(&this->m_rsinbuf);
  return;
}

Assistant:

WDL_Resampler::~WDL_Resampler()
{
  delete m_pre_filter;
  delete m_post_filter;
}